

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

void Curl_req_free(SingleRequest *req,Curl_easy *data)

{
  (*Curl_cfree)((req->p).file);
  (req->p).file = (FILEPROTO *)0x0;
  (*Curl_cfree)(req->newurl);
  req->newurl = (char *)0x0;
  if ((req->field_0xdb & 8) != 0) {
    Curl_bufq_free(&req->sendbuf);
  }
  Curl_client_cleanup(data);
  Curl_doh_cleanup(data);
  return;
}

Assistant:

void Curl_req_free(struct SingleRequest *req, struct Curl_easy *data)
{
  /* This is a bit ugly. `req->p` is a union and we assume we can
   * free this safely without leaks. */
  Curl_safefree(req->p.ftp);
  Curl_safefree(req->newurl);
  if(req->sendbuf_init)
    Curl_bufq_free(&req->sendbuf);
  Curl_client_cleanup(data);

#ifndef CURL_DISABLE_DOH
  Curl_doh_cleanup(data);
#endif
}